

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall
CTPNArglist::gen_code_arglist(CTPNArglist *this,int *varargs,CTcNamedArgs *named_args)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *in_RDX;
  undefined4 *in_RSI;
  CTPNArglistBase *in_RDI;
  int depth;
  int pushed_varargs_counter;
  int fixed_cnt;
  int i;
  CTPNArg *arg;
  uchar in_stack_000000bf;
  CTcGenTarg *in_stack_000000c0;
  uint local_24;
  CTPNArgBase *local_20;
  
  *in_RSI = 0;
  *in_RDX = 0;
  *(CTPNArglistBase **)(in_RDX + 2) = in_RDI;
  for (local_20 = &CTPNArglistBase::get_arg_list_head(in_RDI)->super_CTPNArgBase;
      local_20 != (CTPNArgBase *)0x0;
      local_20 = &CTPNArgBase::get_next_arg(local_20)->super_CTPNArgBase) {
    iVar2 = CTPNArgBase::is_varargs(local_20);
    if (iVar2 == 0) {
      iVar2 = CTPNArgBase::is_named_param((CTPNArgBase *)0x2819cb);
      if (iVar2 != 0) {
        *in_RDX = *in_RDX + 1;
      }
    }
    else {
      *in_RSI = 1;
    }
  }
  if (*in_RDX != 0) {
    for (local_20 = &CTPNArglistBase::get_arg_list_head(in_RDI)->super_CTPNArgBase;
        local_20 != (CTPNArgBase *)0x0;
        local_20 = &CTPNArgBase::get_next_arg(local_20)->super_CTPNArgBase) {
      iVar2 = CTPNArgBase::is_named_param((CTPNArgBase *)0x281a2f);
      if (iVar2 != 0) {
        (**(local_20->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase)(local_20,0);
      }
    }
  }
  bVar1 = false;
  local_24 = in_RDI->argc_;
  local_20 = &CTPNArglistBase::get_arg_list_head(in_RDI)->super_CTPNArgBase;
  while (local_20 != (CTPNArgBase *)0x0) {
    iVar2 = CTPNArgBase::is_named_param((CTPNArgBase *)0x281a95);
    if (iVar2 == 0) {
      iVar2 = CTcGenTarg::get_sp_depth(G_cg);
      iVar3 = CTPNArgBase::is_varargs(local_20);
      if ((iVar3 != 0) && (!bVar1)) {
        CTPNConst::s_gen_code_int(0x281ad2);
        bVar1 = true;
        CTcGenTarg::note_pop((CTcGenTarg *)0x281ae9);
      }
      (**(local_20->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase)(local_20,0);
      if ((bVar1) && (iVar3 = CTPNArgBase::is_varargs(local_20), iVar3 == 0)) {
        CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
      }
      iVar3 = CTcGenTarg::get_sp_depth(G_cg);
      if (iVar3 <= iVar2) {
        CTcTokenizer::log_error(0x2d11,(ulong)local_24);
      }
    }
    local_20 = &CTPNArgBase::get_next_arg(local_20)->super_CTPNArgBase;
    local_24 = local_24 - 1;
  }
  return;
}

Assistant:

void CTPNArglist::gen_code_arglist(int *varargs, CTcNamedArgs &named_args)
{
    CTPNArg *arg;
    int i;
    int fixed_cnt;
    int pushed_varargs_counter;

    /* 
     *   scan the argument list for varargs - if we have any, we must
     *   treat all of them as varargs 
     */
    for (*varargs = FALSE, fixed_cnt = named_args.cnt = 0,
         named_args.args = this, arg = get_arg_list_head() ;
         arg != 0 ;
         arg = arg->get_next_arg())
    {
        /* if this is a varargs argument, we have varargs */
        if (arg->is_varargs())
        {
            /* note it */
            *varargs = TRUE;
        }
        else if (arg->is_named_param())
        {
            /* count the named argument */
            named_args.cnt += 1;
        }
        else
        {
            /* count another fixed positional argument */
            ++fixed_cnt;
        }
    }

    /*
     *   If we have named arguments, push them ahead of the position
     *   arguments.  
     */
    if (named_args.cnt != 0)
    {
        /* 
         *   Run through the argument list again, evaluating only named
         *   arguments on this pass.
         */
        for (i = argc_, arg = get_arg_list_head() ; arg != 0 ;
             arg = arg->get_next_arg(), --i)
        {
            /* if it's a named argument, push it */
            if (arg->is_named_param())
                arg->gen_code(FALSE, FALSE);
        }
    }

    /* 
     *   Push each positional argument in the list.  The arguments on the
     *   stack go in right-to-left order.  The parser builds the internal
     *   list of argument expressions in reverse order, so we must merely
     *   follow the list from head to tail.
     *   
     *   We need each argument value to be pushed (hence discard = false),
     *   and we need the assignable value of each argument expression (hence
     *   for_condition = false).  
     */
    for (pushed_varargs_counter = FALSE, i = argc_,
         arg = get_arg_list_head() ; arg != 0 ;
         arg = arg->get_next_arg(), --i)
    {
        int depth;

        /* skip named arguments on this pass */
        if (arg->is_named_param())
            continue;

        /* note the stack depth before generating the value */
        depth = G_cg->get_sp_depth();

        /* 
         *   check for varargs - if this is first varargs argument, push
         *   the counter placeholder 
         */
        if (arg->is_varargs() && !pushed_varargs_counter)
        {
            /* 
             *   write code to push the fixed argument count - we can use
             *   this as a starting point, since we always know we have
             *   this many argument to start with; we'll dynamically add
             *   in the variable count at run-time 
             */
            CTPNConst::s_gen_code_int(fixed_cnt);
            
            /* note that we've pushed the counter */
            pushed_varargs_counter = TRUE;

            /* 
             *   we will take the extra value off when we evaluate the
             *   varargs counter, so simply count it as removed now 
             */
            G_cg->note_pop();
        }

        /* generate the argument's code */
        arg->gen_code(FALSE, FALSE);

        /* 
         *   if we've pushed the variable argument counter value onto the
         *   stack, and this a fixed argument, swap the top two stack
         *   elements to get the argument counter back to the top of the
         *   stack; if this is a varargs argument there's no need, since
         *   it will have taken care of this 
         */
        if (pushed_varargs_counter && !arg->is_varargs())
            G_cg->write_op(OPC_SWAP);

        /* ensure that it generated something */
        if (G_cg->get_sp_depth() <= depth)
            G_tok->log_error(TCERR_ARG_EXPR_HAS_NO_VAL, i);
    }
}